

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O0

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::MultAdd
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  reference this_00;
  size_type sVar4;
  TPZFMatrix<float> *x_00;
  TPZDohrAssembleList<float> *this_01;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  undefined4 in_XMM0_Da;
  TPZFMatrix<float> *in_stack_00000028;
  TPZFMatrix<float> *in_stack_00000030;
  float in_stack_0000003c;
  TPZDohrSubstructCondense<float> *in_stack_00000040;
  thread assembleThread;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> listThreads;
  TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> data;
  int isub_1;
  const_iterator iter_1;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> multwork;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  uint nglob;
  TPZFMatrix<float> zlocal;
  TPZFMatrix<float> xlocal;
  int isub;
  const_iterator iter;
  TPZSimpleTimer mult;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_stack_fffffffffffffc38;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_stack_fffffffffffffc40;
  double in_stack_fffffffffffffc48;
  TPZSimpleTimer *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  TPZFMatrix<float> *in_stack_fffffffffffffc60;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *this_02;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  undefined4 uVar5;
  TPZFMatrix<float> *in_stack_fffffffffffffc70;
  TPZBaseMatrix *__args;
  TPZFMatrix<float> *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  int numitems;
  TPZDohrAssembleList<float> *in_stack_fffffffffffffc90;
  TPZFMatrix<float> *in_stack_fffffffffffffc98;
  TPZMatrix<float> *in_stack_fffffffffffffca0;
  int local_2d0;
  undefined1 local_2c9 [25];
  _List_node_base *local_2b0;
  _Self local_290;
  _List_node_base *local_288;
  undefined4 local_27c;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> local_278 [14];
  undefined1 local_201;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_1f8;
  undefined4 local_1ec;
  _List_node_base *local_1e8;
  char *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  TPZBaseMatrix local_150 [4];
  const_iterator in_stack_ffffffffffffff40;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> local_a8 [15];
  int local_2c;
  undefined4 local_24;
  TPZBaseMatrix *local_20;
  TPZBaseMatrix *local_18;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *local_10;
  
  local_2c = in_R8D;
  local_24 = in_XMM0_Da;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffc60);
  if (local_2c == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
    if (iVar2 == iVar3) goto LAB_01fd4c4b;
LAB_01fd4c8e:
    TPZMatrix<float>::Error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  else {
LAB_01fd4c4b:
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
    if (iVar2 != iVar3) goto LAB_01fd4c8e;
  }
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  iVar3 = TPZBaseMatrix::Cols(local_18);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
    iVar3 = TPZBaseMatrix::Cols(local_20);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
      iVar3 = TPZBaseMatrix::Rows(local_18);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
        iVar3 = TPZBaseMatrix::Rows(local_20);
        if (iVar2 == iVar3) goto LAB_01fd4dd3;
      }
    }
  }
  TPZMatrix<float>::Error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
LAB_01fd4dd3:
  TPZMatrix<float>::PrepareZ
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (TPZFMatrix<float> *)in_stack_fffffffffffffc90,
             (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),(int)in_stack_fffffffffffffc88);
  numitems = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::_List_const_iterator
            (local_a8);
  if (*(int *)&in_RDI[1].field_0x1c == 0) {
    local_a8[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::begin(in_stack_fffffffffffffc38);
    while( true ) {
      in_stack_ffffffffffffff40 =
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
           ::end(in_stack_fffffffffffffc38);
      bVar1 = std::operator!=(local_a8,(_Self *)&stack0xffffffffffffff40);
      if (!bVar1) break;
      TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffffc70);
      TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffffc70);
      TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 2));
      TPZDohrAssembly<float>::Extract
                ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 in_stack_fffffffffffffc60,
                 (TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
      ;
      TPZBaseMatrix::Rows(local_150);
      TPZBaseMatrix::Cols(local_150);
      TPZFMatrix<float>::Redim
                ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (int64_t)in_stack_fffffffffffffc60,
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      this_00 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
                operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *
                          )in_stack_fffffffffffffc40);
      TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(this_00);
      TPZDohrSubstructCondense<float>::ContributeKULocal
                (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028);
      TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                ((TPZAutoPointer<TPZDohrAssembly<float>_> *)(in_RDI + 2));
      TPZDohrAssembly<float>::Assemble
                ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 in_stack_fffffffffffffc60,
                 (TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
      ;
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fd4faf);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fd4fbc);
      local_1e8 = (_List_node_base *)
                  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
                  operator++(local_a8,0);
    }
  }
  else {
    sVar4 = std::__cxx11::
            list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
            ::size(in_stack_fffffffffffffc40);
    local_1ec = (undefined4)sVar4;
    x_00 = (TPZFMatrix<float> *)operator_new(0xe0);
    local_201 = 1;
    uVar5 = local_1ec;
    TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc40,
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc38);
    TPZDohrAssembleList<float>::TPZDohrAssembleList
              (in_stack_fffffffffffffc90,numitems,in_stack_fffffffffffffc80,
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)x_00);
    local_201 = 0;
    TPZAutoPointer<TPZDohrAssembleList<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<float>_> *)in_stack_fffffffffffffc60,
               (TPZDohrAssembleList<float> *)
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc40);
    TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc40,
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc38);
    TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::TPZDohrThreadMultList
              ((TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *)
               in_stack_fffffffffffffc80,x_00,(float)((ulong)local_20 >> 0x20),
               (TPZAutoPointer<TPZDohrAssembly<float>_> *)CONCAT44(uVar5,local_24),
               (TPZAutoPointer<TPZDohrAssembleList<float>_> *)local_10);
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffc40);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
    _List_const_iterator(local_278);
    local_27c = 0;
    local_288 = (_List_node_base *)
                std::__cxx11::
                list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                ::begin(in_stack_fffffffffffffc38);
    this_02 = local_10;
    __args = local_20;
    local_278[0]._M_node = local_288;
    while( true ) {
      local_290._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
           ::end(in_stack_fffffffffffffc38);
      bVar1 = std::operator!=(local_278,&local_290);
      if (!bVar1) break;
      in_stack_fffffffffffffc5c = local_27c;
      std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator*
                ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                 in_stack_fffffffffffffc40);
      TPZAutoPointer<TPZDohrSubstructCondense<float>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)in_stack_fffffffffffffc40,
                 (TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)in_stack_fffffffffffffc38);
      TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>::TPZDohrThreadMultData
                ((TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> *)
                 in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 (TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)in_stack_fffffffffffffc40);
      TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)in_stack_fffffffffffffc40);
      TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::AddItem
                (this_02,(TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> *)
                         CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>::~TPZDohrThreadMultData
                ((TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> *)0x1fd523d);
      local_2b0 = (_List_node_base *)
                  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
                  operator++(local_278,0);
      local_27c = local_27c + 1;
    }
    in_stack_fffffffffffffc48 = (double)(long)*(int *)&in_RDI[1].field_0x1c;
    in_stack_fffffffffffffc50 = (TPZSimpleTimer *)local_2c9;
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1fd5388);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_02,
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (allocator_type *)in_stack_fffffffffffffc50);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1fd53ae);
    for (local_2d0 = 0; local_2d0 < *(int *)&in_RDI[1].field_0x1c; local_2d0 = local_2d0 + 1) {
      std::thread::
      thread<void*(&)(void*),TPZDohrThreadMultList<float,TPZDohrSubstructCondense<float>>*,void>
                ((thread *)in_stack_fffffffffffffc80,(_func_void_ptr_void_ptr *)x_00,
                 (TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> **)__args);
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)(local_2c9 + 1),
                 (long)local_2d0);
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffc40,(thread *)in_stack_fffffffffffffc38);
      std::thread::~thread((thread *)0x1fd5431);
    }
    this_01 = TPZAutoPointer<TPZDohrAssembleList<float>_>::operator->(&local_1f8);
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
              ((thread *)in_stack_fffffffffffffc80,(_func_void_ptr_void_ptr *)x_00,
               (TPZDohrAssembleList<float> **)__args);
    std::thread::join();
    for (local_2d0 = 0; local_2d0 < *(int *)&in_RDI[1].field_0x1c; local_2d0 = local_2d0 + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)(local_2c9 + 1),
                 (long)local_2d0);
      std::thread::join();
    }
    std::thread::~thread((thread *)0x1fd5557);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc50);
    TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::~TPZDohrThreadMultList
              ((TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *)this_01);
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<float>_> *)this_01);
  }
  TPZSimpleTimer::ReturnTimeDouble(in_stack_fffffffffffffc50);
  TPZStack<double,_10>::Push
            ((TPZStack<double,_10> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  TPZSimpleTimer::~TPZSimpleTimer((TPZSimpleTimer *)in_stack_ffffffffffffff40._M_node);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
											 const TVar alpha,const TVar beta,const int opt) const
{
    
#ifdef USING_TBB 
        MultAddTBB(x, y, z, alpha, beta, opt);
        return;
#endif
        
	TPZSimpleTimer mult;
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	
	typename SubsList::const_iterator iter;
	int isub = 0;
	if (fNumThreads == 0) {
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
            if(0)
            {
                TPZPersistenceManager::OpenWrite("dohr.txt");
                TPZPersistenceManager::WriteToFile(fAssembly.operator ->());
                TPZPersistenceManager::WriteToFile(&x);
                TPZAutoPointer<TSubStruct> point(*iter);
                TPZPersistenceManager::WriteToFile(point.operator ->());
                TPZPersistenceManager::CloseWrite();
                
            }
			TPZFMatrix<TVar> xlocal,zlocal;
			fAssembly->Extract(isub,x,xlocal);
			zlocal.Redim(xlocal.Rows(),xlocal.Cols());
			(*iter)->ContributeKULocal(alpha,xlocal,zlocal);
			fAssembly->Assemble(isub,zlocal,z);
			//         z.Print("Resultado intermediario");
		}		
	}
	else {
        unsigned int nglob = fGlobal.size();
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(nglob,z,this->fAssembly);
		
		TPZDohrThreadMultList<TVar,TSubStruct> multwork(x,alpha,fAssembly,assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator iter;
		int isub=0;
		for (iter=fGlobal.begin(); iter!=fGlobal.end(); iter++,isub++) {
			TPZDohrThreadMultData<TSubStruct> data(isub,*iter);
            
            multwork.AddItem(data);
		}
		std::vector<std::thread> listThreads(fNumThreads);
        int i;
        for (i = 0; i < fNumThreads; i++) {
              listThreads[i] = std::thread(TPZDohrThreadMultList<TVar,TSubStruct>::ThreadWork, &multwork);
        }
        std::thread assembleThread(TPZDohrAssembleList<TVar>::Assemble, assemblelist.operator->());
        assembleThread.join();
        for (i = 0; i < fNumThreads; i++) {
          listThreads[i].join();
        }
	}
	tempo.fMultiply.Push(mult.ReturnTimeDouble());
}